

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseUnion
          (StructTranslator *this,Reader *decl,Reader members,MemberInfo *parent,Union *layout,
          uint *codeOrder)

{
  short sVar1;
  uint uVar2;
  Reader parent_00;
  Reader members_00;
  Reader parent_01;
  Reader members_01;
  Reader decl_00;
  Reader decl_01;
  MemberInfo *params;
  bool bVar3;
  Group *pGVar4;
  Union *layout_00;
  Arena *this_00;
  ListElementCount LVar5;
  StringPtr message;
  StringPtr message_00;
  MemberInfo *memberInfo;
  StructTranslator *local_210;
  MemberInfo *local_208;
  uint subCodeOrder;
  size_t local_1f8;
  Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *local_1f0;
  uint *local_1e8;
  Union *local_1e0;
  ListElementCount local_1d4;
  StructBuilder *local_1d0;
  IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
  local_1c8;
  Reader member;
  Reader local_188;
  Arena *local_150;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
  *local_148;
  NodeSourceInfoBuilderPair local_140;
  Reader local_f0;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  Reader local_90;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_210 = this;
  local_208 = parent;
  local_1e8 = codeOrder;
  local_1e0 = layout;
  if (members.reader.elementCount < 2) {
    message.content.size_ = 0x26;
    message.content.ptr = "Union must have at least two members.";
    ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader_const&>
              (this->errorReporter,decl,message);
  }
  local_1c8.index = 0;
  this_00 = &local_210->arena;
  local_1d0 = &(local_208->node)._builder;
  local_1f0 = (Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
              &local_210->allMembers;
  local_148 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
               *)&local_210->membersByOrdinal;
  local_1d4 = members.reader.elementCount;
  LVar5 = members.reader.elementCount;
  local_1c8.container = &members;
  local_150 = this_00;
  do {
    if (local_1c8.index == LVar5) {
      return;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*(&member,&local_1c8);
    params = local_208;
    memberInfo = (MemberInfo *)0x0;
    if (0x1f < member._reader.dataSize) {
      sVar1 = *(short *)((long)member._reader.data + 2);
      if (sVar1 == 8) {
        local_208->childCount = local_208->childCount + 1;
        pGVar4 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                           (this_00,local_1e0);
        uVar2 = *local_1e8;
        *local_1e8 = uVar2 + 1;
        local_188._reader.segment._0_4_ = uVar2;
        capnp::_::StructBuilder::asReader(local_1d0);
        decl_00._reader.pointerCount = member._reader.pointerCount;
        decl_00._reader._38_2_ = member._reader._38_2_;
        decl_00._reader.dataSize = member._reader.dataSize;
        parent_00._reader.capTable = (CapTableReader *)uStack_b8;
        parent_00._reader.segment = (SegmentReader *)local_c0;
        parent_00._reader.data = (void *)local_b0;
        parent_00._reader.pointers = (WirePointer *)uStack_a8;
        parent_00._reader.dataSize = (undefined4)local_a0;
        parent_00._reader.pointerCount = local_a0._4_2_;
        parent_00._reader._38_2_ = local_a0._6_2_;
        parent_00._reader._40_8_ = uStack_98;
        decl_00._reader.capTable = member._reader.capTable;
        decl_00._reader.segment = member._reader.segment;
        decl_00._reader.data = member._reader.data;
        decl_00._reader.pointers = member._reader.pointers;
        decl_00._reader.nestingLimit = member._reader.nestingLimit;
        decl_00._reader._44_4_ = member._reader._44_4_;
        newGroupNode(&local_140,local_210,parent_00,decl_00);
        _subCodeOrder = (char *)CONCAT71(stack0xfffffffffffffe01,1);
        memberInfo = kj::Arena::
                     allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                               (this_00,local_208,(uint *)&local_188,&member,&local_140,
                                (bool *)&subCodeOrder);
        kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
        add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>(local_1f0,&memberInfo);
        Declaration::Reader::getNestedDecls(&local_f0,&member);
        members_00.reader.capTable = local_f0.reader.capTable;
        members_00.reader.segment = local_f0.reader.segment;
        members_00.reader.ptr = local_f0.reader.ptr;
        members_00.reader.elementCount = local_f0.reader.elementCount;
        members_00.reader.step = local_f0.reader.step;
        members_00.reader.structDataSize = local_f0.reader.structDataSize;
        members_00.reader.structPointerCount = local_f0.reader.structPointerCount;
        members_00.reader.elementSize = local_f0.reader.elementSize;
        members_00.reader._39_1_ = local_f0.reader._39_1_;
        members_00.reader.nestingLimit = local_f0.reader.nestingLimit;
        members_00.reader._44_4_ = local_f0.reader._44_4_;
        traverseGroup(local_210,members_00,memberInfo,&pGVar4->super_StructOrGroup);
      }
      else if (sVar1 == 7) {
        Declaration::Reader::getName((Reader *)&local_140,&member);
        local_188._reader._0_16_ = LocatedText::Reader::getValue((Reader *)&local_140);
        _subCodeOrder = "";
        local_1f8 = 1;
        bVar3 = kj::ArrayPtr<const_char>::operator==
                          ((ArrayPtr<const_char> *)&local_188,(ArrayPtr<const_char> *)&subCodeOrder)
        ;
        if (bVar3) {
          message_00.content.size_ = 0x26;
          message_00.content.ptr = "Unions cannot contain unnamed unions.";
          ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader&>
                    (local_210->errorReporter,&member,message_00);
        }
        else {
          local_208->childCount = local_208->childCount + 1;
          pGVar4 = kj::Arena::
                   allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                             (this_00,local_1e0);
          layout_00 = kj::Arena::
                      allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::Group&>
                                (this_00,pGVar4);
          uVar2 = *local_1e8;
          *local_1e8 = uVar2 + 1;
          local_188._reader.segment._0_4_ = uVar2;
          capnp::_::StructBuilder::asReader(local_1d0);
          decl_01._reader.pointerCount = member._reader.pointerCount;
          decl_01._reader._38_2_ = member._reader._38_2_;
          decl_01._reader.dataSize = member._reader.dataSize;
          parent_01._reader.capTable = (CapTableReader *)uStack_58;
          parent_01._reader.segment = (SegmentReader *)local_60;
          parent_01._reader.data = (void *)local_50;
          parent_01._reader.pointers = (WirePointer *)uStack_48;
          parent_01._reader.dataSize = (undefined4)local_40;
          parent_01._reader.pointerCount = local_40._4_2_;
          parent_01._reader._38_2_ = local_40._6_2_;
          parent_01._reader._40_8_ = uStack_38;
          decl_01._reader.capTable = member._reader.capTable;
          decl_01._reader.segment = member._reader.segment;
          decl_01._reader.data = member._reader.data;
          decl_01._reader.pointers = member._reader.pointers;
          decl_01._reader.nestingLimit = member._reader.nestingLimit;
          decl_01._reader._44_4_ = member._reader._44_4_;
          newGroupNode(&local_140,local_210,parent_01,decl_01);
          _subCodeOrder = (char *)CONCAT71(stack0xfffffffffffffe01,1);
          memberInfo = kj::Arena::
                       allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                                 (this_00,local_208,(uint *)&local_188,&member,&local_140,
                                  (bool *)&subCodeOrder);
          kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
          add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                    (local_1f0,&memberInfo);
          (memberInfo->field_21).unionScope = layout_00;
          _subCodeOrder = (char *)((ulong)_subCodeOrder & 0xffffffff00000000);
          Declaration::Reader::getNestedDecls(&local_90,&member);
          members_01.reader.capTable = local_90.reader.capTable;
          members_01.reader.segment = local_90.reader.segment;
          members_01.reader.ptr = local_90.reader.ptr;
          members_01.reader.elementCount = local_90.reader.elementCount;
          members_01.reader.step = local_90.reader.step;
          members_01.reader.structDataSize = local_90.reader.structDataSize;
          members_01.reader.structPointerCount = local_90.reader.structPointerCount;
          members_01.reader.elementSize = local_90.reader.elementSize;
          members_01.reader._39_1_ = local_90.reader._39_1_;
          members_01.reader.nestingLimit = local_90.reader.nestingLimit;
          members_01.reader._44_4_ = local_90.reader._44_4_;
          traverseUnion(local_210,&member,members_01,memberInfo,layout_00,&subCodeOrder);
          if ((0xf < member._reader.dataSize) && (*member._reader.data == 2)) {
            local_188._reader.nestingLimit = member._reader.nestingLimit;
            local_188._reader._44_4_ = member._reader._44_4_;
            local_188._reader.data = member._reader.data;
            local_188._reader.pointers = member._reader.pointers;
            local_188._reader.capTable = member._reader.capTable;
            local_188._reader.segment = member._reader.segment;
            Declaration::Id::Reader::getOrdinal((Reader *)&local_140,&local_188);
            local_140.node._builder.segment._0_4_ = 0;
            if (0x3f < local_140.node._builder.dataSize) {
              local_140.node._builder.segment._0_4_ = *local_140.node._builder.data;
            }
            goto LAB_00131c2a;
          }
        }
      }
      else if (sVar1 == 6) {
        local_208->childCount = local_208->childCount + 1;
        pGVar4 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                           (this_00,local_1e0);
        local_140.node._builder.segment._0_4_ = *local_1e8;
        *local_1e8 = (uint)local_140.node._builder.segment + 1;
        local_188._reader.segment._0_1_ = 1;
        memberInfo = kj::Arena::
                     allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::Group&,bool>
                               (this_00,params,(uint *)&local_140,&member,pGVar4,(bool *)&local_188)
        ;
        kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
        add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>(local_1f0,&memberInfo);
        local_188._reader.nestingLimit = member._reader.nestingLimit;
        local_188._reader._44_4_ = member._reader._44_4_;
        local_188._reader.data = member._reader.data;
        local_188._reader.pointers = member._reader.pointers;
        local_188._reader.capTable = member._reader.capTable;
        local_188._reader.segment = member._reader.segment;
        Declaration::Id::Reader::getOrdinal((Reader *)&local_140,&local_188);
        local_140.node._builder.segment._0_4_ = 0;
        this_00 = local_150;
        LVar5 = local_1d4;
        if (0x3f < local_140.node._builder.dataSize) {
          local_140.node._builder.segment._0_4_ = *local_140.node._builder.data;
        }
LAB_00131c2a:
        local_140.node._builder.capTable = (CapTableBuilder *)memberInfo;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
        ::
        _M_emplace_equal<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                  (local_148,
                   (pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>
                    *)&local_140);
      }
    }
    local_1c8.index = local_1c8.index + 1;
  } while( true );
}

Assistant:

void traverseUnion(const Declaration::Reader& decl,
                     List<Declaration>::Reader members, MemberInfo& parent,
                     StructLayout::Union& layout, uint& codeOrder) {
    if (members.size() < 2) {
      errorReporter.addErrorOn(decl, "Union must have at least two members.");
    }

    for (auto member: members) {
      kj::Maybe<uint> ordinal;
      MemberInfo* memberInfo = nullptr;

      switch (member.which()) {
        case Declaration::FIELD: {
          parent.childCount++;
          // For layout purposes, pretend this field is enclosed in a one-member group.
          StructLayout::Group& singletonGroup =
              arena.allocate<StructLayout::Group>(layout);
          memberInfo = &arena.allocate<MemberInfo>(parent, codeOrder++, member, singletonGroup,
                                                   true);
          allMembers.add(memberInfo);
          ordinal = member.getId().getOrdinal().getValue();
          break;
        }

        case Declaration::UNION:
          if (member.getName().getValue() == "") {
            errorReporter.addErrorOn(member, "Unions cannot contain unnamed unions.");
          } else {
            parent.childCount++;

            // For layout purposes, pretend this union is enclosed in a one-member group.
            StructLayout::Group& singletonGroup =
                arena.allocate<StructLayout::Group>(layout);
            StructLayout::Union& unionLayout = arena.allocate<StructLayout::Union>(singletonGroup);

            memberInfo = &arena.allocate<MemberInfo>(
                parent, codeOrder++, member,
                newGroupNode(parent.node, member),
                true);
            allMembers.add(memberInfo);
            memberInfo->unionScope = &unionLayout;
            uint subCodeOrder = 0;
            traverseUnion(member, member.getNestedDecls(), *memberInfo, unionLayout, subCodeOrder);
            if (member.getId().isOrdinal()) {
              ordinal = member.getId().getOrdinal().getValue();
            }
          }
          break;

        case Declaration::GROUP: {
          parent.childCount++;
          StructLayout::Group& group = arena.allocate<StructLayout::Group>(layout);
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member,
              newGroupNode(parent.node, member),
              true);
          allMembers.add(memberInfo);
          traverseGroup(member.getNestedDecls(), *memberInfo, group);
          break;
        }

        default:
          // Ignore others.
          break;
      }

      KJ_IF_SOME(o, ordinal) {
        membersByOrdinal.insert(std::make_pair(o, memberInfo));
      }
    }
  }